

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  string *psVar4;
  size_t s;
  ifstream fin;
  char buffer [16384];
  string local_4270;
  string *local_4250;
  char *local_4248;
  long local_4240;
  size_t local_4238;
  byte abStack_4220 [488];
  size_type *local_4038 [2];
  size_type local_4028 [2047];
  
  std::ifstream::ifstream(&local_4240,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(local_4240 + -0x18)] & 5) == 0) {
    local_4250 = &this->Error;
    local_4248 = file;
    do {
      if (size == 0) {
        size = 0;
        goto LAB_00138d87;
      }
      s = 0x4000;
      if (size < 0x4000) {
        s = size;
      }
      std::istream::read((char *)&local_4240,(long)local_4038);
      iVar1 = 3;
      if (local_4238 == s) {
        sVar2 = archive_write_data(this->Archive,local_4038,s);
        if (sVar2 == s) {
          size = size - s;
          iVar1 = 0;
        }
        else {
          std::__cxx11::string::_M_replace
                    ((ulong)local_4250,0,(char *)(this->Error)._M_string_length,0x1d5404);
          cm_archive_error_string_abi_cxx11_(&local_4270,this->Archive);
          std::__cxx11::string::_M_append((char *)local_4250,(ulong)local_4270._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4270._M_dataplus._M_p != &local_4270.field_2) {
            operator_delete(local_4270._M_dataplus._M_p,local_4270.field_2._M_allocated_capacity + 1
                           );
          }
          iVar1 = 1;
        }
      }
    } while (iVar1 == 0);
    if (iVar1 == 3) {
LAB_00138d87:
      psVar4 = local_4250;
      if (size == 0) {
        bVar3 = true;
        goto LAB_00138e06;
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_4250,0,(char *)(this->Error)._M_string_length,0x1d5419);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_4270._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4270._M_dataplus._M_p != &local_4270.field_2) goto LAB_00138dfc;
    }
  }
  else {
    psVar4 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar4,0,(char *)(this->Error)._M_string_length,0x1d53f4);
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_4038[0]);
    local_4270.field_2._M_allocated_capacity = local_4028[0];
    local_4270._M_dataplus._M_p = (pointer)local_4038[0];
    if (local_4038[0] != local_4028) {
LAB_00138dfc:
      operator_delete(local_4270._M_dataplus._M_p,local_4270.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_00138e06:
  std::ifstream::~ifstream(&local_4240);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | cmsys_ios_binary);
  if(!fin)
    {
    this->Error = "Error opening \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }

  char buffer[16384];
  size_t nleft = size;
  while(nleft > 0)
    {
    typedef cmsys_ios::streamsize ssize_type;
    size_t const nnext = nleft > sizeof(buffer)? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if(static_cast<size_t>(fin.gcount()) != nnext)
      {
      break;
      }
    if(archive_write_data(this->Archive, buffer, nnext) != nnext_s)
      {
      this->Error = "archive_write_data: ";
      this->Error += cm_archive_error_string(this->Archive);
      return false;
      }
    nleft -= nnext;
    }
  if(nleft > 0)
    {
    this->Error = "Error reading \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }
  return true;
}